

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::Renderer::renderStockPileUncoveredCards
          (Renderer *this,Cards *pileCards,SelectedCardIndex *selectedCardIndex,
          StockPileCollider *collider)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  Position cardPosition;
  Position local_30;
  
  if ((selectedCardIndex->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    local_30.x = 0x69;
    local_30.y = 0x1e;
    iVar1 = (*collider->_vptr_StockPileCollider[5])(collider);
    iVar2 = 0x69;
    while (iVar2 <= iVar1) {
      puVar3 = std::optional<unsigned_int>::value(selectedCardIndex);
      renderCard(this,&local_30,
                 (pileCards->
                 super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                 )._M_impl.super__Vector_impl_data._M_start + *puVar3);
      iVar2 = local_30.x + 2;
      local_30.x = iVar2;
    }
  }
  return;
}

Assistant:

void Renderer::renderStockPileUncoveredCards(
    const Cards& pileCards, const SelectedCardIndex& selectedCardIndex,
    const StockPileCollider& collider) const
{
    if (not selectedCardIndex) return;

    auto cardPosition = Layout::stockPilePosition;
    cardPosition.x += Layout::pilesSpacing;
    const auto uncoveredCardsPosition = collider.getUncoveredCardsPosition();

    while (cardPosition.x <= uncoveredCardsPosition.x) {
        renderCard(cardPosition, pileCards[selectedCardIndex.value()]);
        cardPosition.x += Layout::stockPileCardsSpacing;
    }
}